

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5UnicodeCatParse(char *zCat,u8 *aArray)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  
  *aArray = '\x01';
  iVar3 = 0;
  switch(*zCat) {
  case 'L':
    cVar1 = zCat[1];
    iVar3 = 1;
    switch(cVar1) {
    case 'l':
      aArray[5] = '\x01';
      break;
    case 'm':
      aArray[6] = '\x01';
      break;
    case 'n':
    case 'p':
    case 'q':
    case 'r':
    case 's':
      goto switchD_001d60c2_caseD_4f;
    case 'o':
      aArray[7] = '\x01';
      break;
    case 't':
      aArray[8] = '\x01';
      break;
    case 'u':
      aArray[9] = '\x01';
      break;
    default:
      if (cVar1 == '*') {
        aArray[0x1e] = '\x01';
        builtin_memcpy(aArray + 5,"\x01\x01\x01\x01\x01",5);
      }
      else {
        if (cVar1 != 'C') {
          return 1;
        }
        aArray[0x1e] = '\x01';
      }
    }
    break;
  case 'M':
    bVar2 = zCat[1];
    if (bVar2 < 0x65) {
      if (bVar2 == 0x2a) {
        aArray[10] = '\x01';
        aArray[0xb] = '\x01';
LAB_001d62e9:
        aArray[0xc] = '\x01';
      }
      else {
        if (bVar2 != 99) {
          return 1;
        }
        aArray[10] = '\x01';
      }
    }
    else {
      if (bVar2 != 0x65) {
        if (bVar2 != 0x6e) {
          return 1;
        }
        goto LAB_001d62e9;
      }
      aArray[0xb] = '\x01';
    }
    break;
  case 'N':
    bVar2 = zCat[1];
    if (bVar2 < 0x6c) {
      if (bVar2 == 0x2a) {
        aArray[0xd] = '\x01';
        aArray[0xe] = '\x01';
LAB_001d62b9:
        aArray[0xf] = '\x01';
      }
      else {
        if (bVar2 != 100) {
          return 1;
        }
        aArray[0xd] = '\x01';
      }
    }
    else {
      if (bVar2 != 0x6c) {
        if (bVar2 != 0x6f) {
          return 1;
        }
        goto LAB_001d62b9;
      }
      aArray[0xe] = '\x01';
    }
    break;
  case 'O':
  case 'Q':
  case 'R':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
    goto switchD_001d60c2_caseD_4f;
  case 'P':
    iVar3 = 1;
    switch(zCat[1]) {
    case 'c':
      aArray[0x10] = '\x01';
      break;
    case 'd':
      aArray[0x11] = '\x01';
      break;
    case 'e':
      aArray[0x12] = '\x01';
      break;
    case 'f':
      aArray[0x13] = '\x01';
      break;
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_001d60c2_caseD_4f;
    case 'i':
      aArray[0x14] = '\x01';
      break;
    case 'o':
      aArray[0x15] = '\x01';
      break;
    case 's':
      aArray[0x16] = '\x01';
      break;
    default:
      if (zCat[1] != '*') {
        return 1;
      }
      builtin_memcpy(aArray + 0x10,"\x01\x01\x01\x01\x01\x01\x01",7);
    }
    break;
  case 'S':
    bVar2 = zCat[1];
    if (bVar2 < 0x6b) {
      if (bVar2 == 0x2a) {
        builtin_memcpy(aArray + 0x17,"\x01\x01\x01\x01",4);
      }
      else {
        if (bVar2 != 99) {
          return 1;
        }
        aArray[0x17] = '\x01';
      }
    }
    else if (bVar2 == 0x6b) {
      aArray[0x18] = '\x01';
    }
    else if (bVar2 == 0x6d) {
      aArray[0x19] = '\x01';
    }
    else {
      if (bVar2 != 0x6f) {
        return 1;
      }
      aArray[0x1a] = '\x01';
    }
    break;
  case 'Z':
    bVar2 = zCat[1];
    if (bVar2 < 0x70) {
      if (bVar2 == 0x2a) {
        aArray[0x1b] = '\x01';
        aArray[0x1c] = '\x01';
LAB_001d62d1:
        aArray[0x1d] = '\x01';
      }
      else {
        if (bVar2 != 0x6c) {
          return 1;
        }
        aArray[0x1b] = '\x01';
      }
    }
    else {
      if (bVar2 != 0x70) {
        if (bVar2 != 0x73) {
          return 1;
        }
        goto LAB_001d62d1;
      }
      aArray[0x1c] = '\x01';
    }
    break;
  default:
    if (*zCat != 'C') {
      return 0;
    }
    bVar2 = zCat[1];
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x2a) {
        aArray[0x1f] = '\x01';
        builtin_memcpy(aArray + 1,"\x01\x01\x01\x01",4);
      }
      else if (bVar2 == 99) {
        aArray[1] = '\x01';
      }
      else {
        if (bVar2 != 0x66) {
          return 1;
        }
        aArray[2] = '\x01';
      }
    }
    else if (bVar2 == 0x6e) {
      aArray[3] = '\x01';
    }
    else if (bVar2 == 0x6f) {
      aArray[0x1f] = '\x01';
    }
    else {
      if (bVar2 != 0x73) {
        return 1;
      }
      aArray[4] = '\x01';
    }
  }
  iVar3 = 0;
switchD_001d60c2_caseD_4f:
  return iVar3;
}

Assistant:

static int sqlite3Fts5UnicodeCatParse(const char *zCat, u8 *aArray){ 
  aArray[0] = 1;
  switch( zCat[0] ){
    case 'C':
          switch( zCat[1] ){
            case 'c': aArray[1] = 1; break;
            case 'f': aArray[2] = 1; break;
            case 'n': aArray[3] = 1; break;
            case 's': aArray[4] = 1; break;
            case 'o': aArray[31] = 1; break;
            case '*': 
              aArray[1] = 1;
              aArray[2] = 1;
              aArray[3] = 1;
              aArray[4] = 1;
              aArray[31] = 1;
              break;
            default: return 1;          }
          break;

    case 'L':
          switch( zCat[1] ){
            case 'l': aArray[5] = 1; break;
            case 'm': aArray[6] = 1; break;
            case 'o': aArray[7] = 1; break;
            case 't': aArray[8] = 1; break;
            case 'u': aArray[9] = 1; break;
            case 'C': aArray[30] = 1; break;
            case '*': 
              aArray[5] = 1;
              aArray[6] = 1;
              aArray[7] = 1;
              aArray[8] = 1;
              aArray[9] = 1;
              aArray[30] = 1;
              break;
            default: return 1;          }
          break;

    case 'M':
          switch( zCat[1] ){
            case 'c': aArray[10] = 1; break;
            case 'e': aArray[11] = 1; break;
            case 'n': aArray[12] = 1; break;
            case '*': 
              aArray[10] = 1;
              aArray[11] = 1;
              aArray[12] = 1;
              break;
            default: return 1;          }
          break;

    case 'N':
          switch( zCat[1] ){
            case 'd': aArray[13] = 1; break;
            case 'l': aArray[14] = 1; break;
            case 'o': aArray[15] = 1; break;
            case '*': 
              aArray[13] = 1;
              aArray[14] = 1;
              aArray[15] = 1;
              break;
            default: return 1;          }
          break;

    case 'P':
          switch( zCat[1] ){
            case 'c': aArray[16] = 1; break;
            case 'd': aArray[17] = 1; break;
            case 'e': aArray[18] = 1; break;
            case 'f': aArray[19] = 1; break;
            case 'i': aArray[20] = 1; break;
            case 'o': aArray[21] = 1; break;
            case 's': aArray[22] = 1; break;
            case '*': 
              aArray[16] = 1;
              aArray[17] = 1;
              aArray[18] = 1;
              aArray[19] = 1;
              aArray[20] = 1;
              aArray[21] = 1;
              aArray[22] = 1;
              break;
            default: return 1;          }
          break;

    case 'S':
          switch( zCat[1] ){
            case 'c': aArray[23] = 1; break;
            case 'k': aArray[24] = 1; break;
            case 'm': aArray[25] = 1; break;
            case 'o': aArray[26] = 1; break;
            case '*': 
              aArray[23] = 1;
              aArray[24] = 1;
              aArray[25] = 1;
              aArray[26] = 1;
              break;
            default: return 1;          }
          break;

    case 'Z':
          switch( zCat[1] ){
            case 'l': aArray[27] = 1; break;
            case 'p': aArray[28] = 1; break;
            case 's': aArray[29] = 1; break;
            case '*': 
              aArray[27] = 1;
              aArray[28] = 1;
              aArray[29] = 1;
              break;
            default: return 1;          }
          break;

  }
  return 0;
}